

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

void __thiscall stackjit::ByteCodeParser::nextTokenAtEnd(ByteCodeParser *this)

{
  string sStack_28;
  
  if (this->mTokenIndex ==
      ((long)(this->mTokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->mTokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    this->mTokenIndex = this->mTokenIndex + 1;
    return;
  }
  nextToken_abi_cxx11_(&sStack_28,this);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void ByteCodeParser::nextTokenAtEnd() {
		if (mTokenIndex != mTokens.size() - 1) {
			nextToken();
		} else {
			mTokenIndex++;
		}
	}